

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Search_Digits_OnePass(int i)

{
  int i_local;
  
  SearchDigits(i,SearchOnePass);
  return;
}

Assistant:

void Search_Digits_OnePass(int i)     { SearchDigits(i, SearchOnePass); }